

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# po_man.cpp
# Opt level: O1

bool __thiscall FPolyObj::CheckMobjBlocking(FPolyObj *this,side_t *sd)

{
  double dVar1;
  double dVar2;
  double dVar3;
  int iVar4;
  line_t_conflict *linedef;
  AActor *thing;
  sector_t_conflict *psVar5;
  long lVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  ulong uVar10;
  int iVar11;
  int iVar12;
  FBlockNode *pFVar13;
  int iVar14;
  uint uVar15;
  uint uVar16;
  int iVar17;
  int iVar18;
  long lVar19;
  double dVar20;
  FBoundingBox box;
  FLineOpening open;
  FBoundingBox local_f0;
  DVector2 local_d0;
  FLineOpening local_c0;
  
  if (CheckMobjBlocking(side_t*)::checker == '\0') {
    CheckMobjBlocking();
  }
  linedef = sd->linedef;
  iVar12 = (int)((linedef->bbox[0] - bmaporgy) * 0.0078125);
  iVar14 = (int)((linedef->bbox[1] - bmaporgy) * 0.0078125);
  if (CheckMobjBlocking::checker.Count != 0) {
    CheckMobjBlocking::checker.Count = 0;
  }
  bVar7 = false;
  iVar11 = 0;
  if (iVar14 < 1) {
    iVar14 = iVar11;
  }
  if (bmapheight <= iVar14) {
    iVar14 = bmapheight + -1;
  }
  if (iVar12 < 1) {
    iVar12 = iVar11;
  }
  if (bmapheight <= iVar12) {
    iVar12 = bmapheight + -1;
  }
  iVar14 = iVar14 * bmapwidth;
  if (iVar14 <= bmapwidth * iVar12) {
    iVar17 = (int)((linedef->bbox[2] - bmaporgx) * 0.0078125);
    iVar18 = (int)((linedef->bbox[3] - bmaporgx) * 0.0078125);
    if (iVar18 < 1) {
      iVar18 = iVar11;
    }
    if (bmapwidth <= iVar18) {
      iVar18 = bmapwidth + -1;
    }
    bVar7 = false;
    if (iVar17 < 1) {
      iVar17 = 0;
    }
    if (bmapwidth <= iVar17) {
      iVar17 = bmapwidth + -1;
    }
    do {
      if (iVar17 <= iVar18) {
        lVar19 = (long)iVar17;
        do {
          for (pFVar13 = blocklinks[lVar19 + iVar14]; pFVar13 != (FBlockNode *)0x0;
              pFVar13 = pFVar13->NextActor) {
            thing = pFVar13->Me;
            uVar15 = CheckMobjBlocking::checker.Count + 1;
            uVar10 = (ulong)CheckMobjBlocking::checker.Count;
            do {
              uVar16 = (int)CheckMobjBlocking::checker.Count >> 0x1f &
                       CheckMobjBlocking::checker.Count;
              if ((int)uVar10 < 1) break;
              uVar15 = uVar15 - 1;
              lVar6 = uVar10 - 1;
              uVar10 = uVar10 - 1;
              uVar16 = uVar15;
            } while (CheckMobjBlocking::checker.Array[lVar6] != thing);
            if ((int)uVar16 < 1) {
              TArray<AActor_*,_AActor_*>::Grow(&CheckMobjBlocking::checker,1);
              CheckMobjBlocking::checker.Array[CheckMobjBlocking::checker.Count] = thing;
              CheckMobjBlocking::checker.Count = CheckMobjBlocking::checker.Count + 1;
              uVar15 = (thing->flags).Value;
              if ((uVar15 & 0x1002) == 2) {
                local_c0.top = 3.4028234663852886e+38;
                local_c0.bottom = -3.4028234663852886e+38;
                if ((((((linedef->backsector == (sector_t_conflict *)0x0) ||
                       (uVar16 = linedef->flags, (uVar16 & 0x8001) != 0)) ||
                      (((uVar16 >> 0xe & 1) != 0 && (thing->player != (player_t *)0x0)))) ||
                     (((uVar16 & 2) != 0 && (((thing->flags3).Value & 0x2000) != 0)))) ||
                    (((uVar15 >> 0xe & 1) != 0 && ((uVar16 & 0x40000) != 0)))) ||
                   ((((uVar16 >> 0x15 & 1) != 0 &&
                     ((bVar8 = P_LineOpening_3dMidtex(thing,linedef,&local_c0,false), bVar8 ||
                      (local_c0.top <= (thing->__Pos).Z + thing->Height)))) &&
                    ((local_c0.abovemidtex != true ||
                     (dVar1 = (thing->__Pos).Z, dVar1 < thing->floorz || dVar1 == thing->floorz)))))
                   ) {
                  bVar8 = true;
                }
                else {
                  bVar8 = false;
                }
                iVar11 = thing->Sector->PortalGroup;
                iVar4 = linedef->frontsector->PortalGroup;
                local_f0.m_Box[3] = 0.0;
                local_f0.m_Box[1] = 0.0;
                if (iVar11 != iVar4) {
                  iVar11 = iVar4 * Displacements.size + iVar11;
                  local_f0.m_Box[3] = Displacements.data.Array[iVar11].pos.X;
                  local_f0.m_Box[1] = Displacements.data.Array[iVar11].pos.Y;
                }
                local_f0.m_Box[1] = (thing->__Pos).Y + local_f0.m_Box[1];
                local_f0.m_Box[3] = (thing->__Pos).X + local_f0.m_Box[3];
                dVar1 = thing->radius;
                local_f0.m_Box[0] = local_f0.m_Box[1] + dVar1;
                local_f0.m_Box[2] = local_f0.m_Box[3] - dVar1;
                local_f0.m_Box[3] = local_f0.m_Box[3] + dVar1;
                local_f0.m_Box[1] = local_f0.m_Box[1] - dVar1;
                if ((((local_f0.m_Box[2] < linedef->bbox[3]) &&
                     (linedef->bbox[2] <= local_f0.m_Box[3] && local_f0.m_Box[3] != linedef->bbox[2]
                     )) && (linedef->bbox[1] <= local_f0.m_Box[0] &&
                            local_f0.m_Box[0] != linedef->bbox[1])) &&
                   ((local_f0.m_Box[1] < linedef->bbox[0] &&
                    (iVar11 = FBoundingBox::BoxOnLineSide(&local_f0,(line_t *)linedef), iVar11 == -1
                    )))) {
                  if ((linedef->portalindex < linePortals.Count) &&
                     ((linePortals.Array[linedef->portalindex].mFlags & 2) != 0)) {
                    local_d0.X = (thing->__Pos).X;
                    local_d0.Y = (thing->__Pos).Y;
                    bVar9 = P_TryMove(thing,&local_d0,0,(secplane_t *)0x0);
                    if (bVar9) goto LAB_004721bb;
                  }
                  if (linedef->sidedef[1] != (side_t *)0x0) {
                    dVar1 = (thing->__Pos).X;
                    dVar2 = (thing->__Pos).Y;
                    dVar20 = ((linedef->v1->p).X - dVar1) * (linedef->delta).Y +
                             (dVar2 - (linedef->v1->p).Y) * (linedef->delta).X;
                    if ((linedef->sidedef[1.52587890625e-05 < dVar20] == sd) && (!bVar8)) {
                      psVar5 = linedef->sidedef[dVar20 <= 1.52587890625e-05]->sector;
                      dVar3 = (thing->__Pos).Z;
                      if ((dVar3 < ((psVar5->floorplane).normal.Y * dVar2 +
                                   (psVar5->floorplane).normal.X * dVar1 + (psVar5->floorplane).D) *
                                   (psVar5->floorplane).negiC) ||
                         ((dVar2 * (psVar5->ceilingplane).normal.Y +
                          dVar1 * (psVar5->ceilingplane).normal.X + (psVar5->ceilingplane).D) *
                          (psVar5->ceilingplane).negiC < dVar3 + thing->Height)) {
                        bVar8 = true;
                      }
                    }
                    if (linedef->sidedef[1.52587890625e-05 < dVar20] != sd) goto LAB_004721bb;
                  }
                  if (bVar8) {
                    ThrustMobj(this,thing,sd);
                    bVar7 = true;
                  }
                }
              }
            }
LAB_004721bb:
          }
          lVar19 = lVar19 + 1;
        } while (iVar18 + 1 != (int)lVar19);
      }
      iVar14 = iVar14 + bmapwidth;
    } while (iVar14 <= bmapwidth * iVar12);
  }
  return bVar7;
}

Assistant:

bool FPolyObj::CheckMobjBlocking (side_t *sd)
{
	static TArray<AActor *> checker;
	FBlockNode *block;
	AActor *mobj;
	int i, j, k;
	int left, right, top, bottom;
	line_t *ld;
	bool blocked;
	bool performBlockingThrust;

	ld = sd->linedef;

	top = GetBlockY(ld->bbox[BOXTOP]);
	bottom = GetBlockY(ld->bbox[BOXBOTTOM]);
	left = GetBlockX(ld->bbox[BOXLEFT]);
	right = GetBlockX(ld->bbox[BOXRIGHT]);

	blocked = false;
	checker.Clear();

	bottom = bottom < 0 ? 0 : bottom;
	bottom = bottom >= bmapheight ? bmapheight-1 : bottom;
	top = top < 0 ? 0 : top;
	top = top >= bmapheight  ? bmapheight-1 : top;
	left = left < 0 ? 0 : left;
	left = left >= bmapwidth ? bmapwidth-1 : left;
	right = right < 0 ? 0 : right;
	right = right >= bmapwidth ?  bmapwidth-1 : right;

	for (j = bottom*bmapwidth; j <= top*bmapwidth; j += bmapwidth)
	{
		for (i = left; i <= right; i++)
		{
			for (block = blocklinks[j+i]; block != NULL; block = block->NextActor)
			{
				mobj = block->Me;
				for (k = (int)checker.Size()-1; k >= 0; --k)
				{
					if (checker[k] == mobj)
					{
						break;
					}
				}
				if (k < 0)
				{
					checker.Push (mobj);
					if ((mobj->flags&MF_SOLID) && !(mobj->flags&MF_NOCLIP))
					{
						FLineOpening open;
						open.top = LINEOPEN_MAX;
						open.bottom = LINEOPEN_MIN;
						// [TN] Check wether this actor gets blocked by the line.
						if (ld->backsector != NULL &&
							!(ld->flags & (ML_BLOCKING|ML_BLOCKEVERYTHING))
							&& !(ld->flags & ML_BLOCK_PLAYERS && mobj->player) 
							&& !(ld->flags & ML_BLOCKMONSTERS && mobj->flags3 & MF3_ISMONSTER)
							&& !((mobj->flags & MF_FLOAT) && (ld->flags & ML_BLOCK_FLOATERS))
							&& (!(ld->flags & ML_3DMIDTEX) ||
								(!P_LineOpening_3dMidtex(mobj, ld, open) &&
									(mobj->Top() < open.top)
								) || (open.abovemidtex && mobj->Z() > mobj->floorz))
							)
						{
							// [BL] We can't just continue here since we must
							// determine if the line's backsector is going to
							// be blocked.
							performBlockingThrust = false;
						}
						else
						{
							performBlockingThrust = true;
						}

						DVector2 pos = mobj->PosRelative(ld);
						FBoundingBox box(pos.X, pos.Y, mobj->radius);

						if (!box.inRange(ld) || box.BoxOnLineSide(ld) != -1)
						{
							continue;
						}

						if (ld->isLinePortal())
						{
							// Fixme: this still needs to figure out if the polyobject move made the player cross the portal line.
							if (P_TryMove(mobj, mobj->Pos(), false))
							{
								continue;
							}
						}
						// We have a two-sided linedef so we should only check one side
						// so that the thrust from both sides doesn't cancel each other out.
						// Best use the one facing the player and ignore the back side.
						if (ld->sidedef[1] != NULL)
						{
							int side = P_PointOnLineSidePrecise(mobj->Pos(), ld);
							if (ld->sidedef[side] != sd)
							{
								continue;
							}
							// [BL] See if we hit below the floor/ceiling of the poly.
							else if(!performBlockingThrust && (
									mobj->Z() < ld->sidedef[!side]->sector->GetSecPlane(sector_t::floor).ZatPoint(mobj) ||
									mobj->Top() > ld->sidedef[!side]->sector->GetSecPlane(sector_t::ceiling).ZatPoint(mobj)
								))
							{
								performBlockingThrust = true;
							}
						}

						if(performBlockingThrust)
						{
							ThrustMobj (mobj, sd);
							blocked = true;
						}
						else
							continue;
					}
				}
			}
		}
	}
	return blocked;
}